

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

void fill_room(level *lev,mkroom *croom,boolean prefilled)

{
  undefined1 *puVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  char cVar5;
  int y;
  int x;
  
  if (croom == (mkroom *)0x0) {
    return;
  }
  bVar3 = croom->rtype;
  if (bVar3 == 0) {
    return;
  }
  if (prefilled == '\0') {
    uVar4 = (uint)bVar3;
    if ('\x11' < (char)bVar3) {
      stock_room(uVar4 - 0x12 & 0xff,lev,croom);
      uVar4 = 1;
      goto LAB_0024c023;
    }
    if (uVar4 < 0x11) {
      if ((0x141e4U >> (uVar4 & 0x1f) & 1) == 0) {
        if (uVar4 == 4) {
          cVar5 = croom->hx;
          if (croom->lx <= cVar5) {
            uVar4 = (uint)(byte)croom->hy;
            x = (int)croom->lx;
            do {
              y = (int)croom->ly;
              if (croom->ly <= (char)uVar4) {
                do {
                  bVar3 = depth(&lev->z);
                  uVar4 = mt_random();
                  mkgold((ulong)(uVar4 % ((uint)(byte)((bVar3 ^ (char)bVar3 >> 7) -
                                                      ((char)bVar3 >> 7)) * 100) + 0x33),lev,x,y);
                  uVar4 = (uint)croom->hy;
                  bVar2 = y < (int)uVar4;
                  y = y + 1;
                } while (bVar2);
                cVar5 = croom->hx;
              }
              bVar2 = x < cVar5;
              x = x + 1;
            } while (bVar2);
          }
        }
      }
      else {
        fill_zoo(lev,croom);
      }
    }
    bVar3 = croom->rtype;
  }
  bVar3 = bVar3 - 2;
  if (0xe < bVar3) {
    return;
  }
  if ((0x517fU >> (bVar3 & 0x1f) & 1) == 0) {
    return;
  }
  uVar4 = *(uint *)(&DAT_002d21f0 + (ulong)bVar3 * 4);
LAB_0024c023:
  puVar1 = &(lev->flags).field_0x8;
  *(uint *)puVar1 = *(uint *)puVar1 | uVar4;
  return;
}

Assistant:

void fill_room(struct level *lev, struct mkroom *croom, boolean prefilled)
{
	if (!croom || croom->rtype == OROOM)
	    return;

	if (!prefilled) {
	    int x, y;

	    /* Shop ? */
	    if (croom->rtype >= SHOPBASE) {
		stock_room(croom->rtype - SHOPBASE, lev, croom);
		lev->flags.has_shop = TRUE;
		return;
	    }

	    switch (croom->rtype) {
		case VAULT:
		    for (x = croom->lx; x <= croom->hx; x++)
			for (y = croom->ly; y<=croom->hy; y++)
			    mkgold((long)rn1(abs(depth(&lev->z)) * 100, 51),
				   lev, x, y);
		    break;
		case GARDEN:
		case COURT:
		case ZOO:
		case BEEHIVE:
		case LEMUREPIT:
		case MORGUE:
		case BARRACKS:
		    fill_zoo(lev, croom);
		    break;
	    }
	}
	switch (croom->rtype) {
	    case VAULT:
		lev->flags.has_vault = TRUE;
		break;
	    case ZOO:
		lev->flags.has_zoo = TRUE;
		break;
	    case GARDEN:
		lev->flags.has_garden = TRUE;
		break;
	    case COURT:
		lev->flags.has_court = TRUE;
		break;
	    case MORGUE:
		lev->flags.has_morgue = TRUE;
		break;
	    case BEEHIVE:
		lev->flags.has_beehive = TRUE;
		break;
	    case LEMUREPIT:
		lev->flags.has_lemurepit = TRUE;
		break;
	    case BARRACKS:
		lev->flags.has_barracks = TRUE;
		break;
	    case TEMPLE:
		lev->flags.has_temple = TRUE;
		break;
	    case SWAMP:
		lev->flags.has_swamp = TRUE;
		break;
	}
}